

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void google::protobuf::compiler::javanano::anon_unknown_3::SetEnumVariables
               (Params *params,FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  FieldDescriptor *params_00;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  int iVar5;
  Type TVar6;
  WireType type;
  mapped_type *pmVar7;
  protobuf *this;
  Descriptor *pDVar8;
  string *psVar9;
  FileDescriptor *file;
  FieldDescriptor *in_RCX;
  int i;
  uint i_00;
  uint i_01;
  FieldDescriptor *field;
  unsigned_long i_02;
  allocator local_399;
  key_type local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  EnumDescriptor *local_338;
  EnumDescriptor *enum_type;
  key_type local_328;
  allocator local_301;
  key_type local_300;
  string local_2e0;
  allocator local_2b9;
  key_type local_2b8;
  string local_298;
  allocator local_271;
  key_type local_270;
  string local_250;
  allocator local_229;
  key_type local_228;
  allocator local_201;
  key_type local_200;
  string local_1e0;
  allocator local_1b9;
  key_type local_1b8;
  allocator local_191;
  key_type local_190;
  allocator local_169;
  key_type local_168;
  allocator local_141;
  key_type local_140;
  string local_120;
  allocator local_f9;
  key_type local_f8;
  string local_d8;
  string local_b8;
  allocator local_91;
  key_type local_90;
  string local_60;
  string local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldDescriptor *descriptor_local;
  Params *params_local;
  
  local_20 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)descriptor;
  descriptor_local = (FieldDescriptor *)params;
  UnderscoresToCamelCase_abi_cxx11_(&local_60,(javanano *)descriptor,(FieldDescriptor *)variables);
  RenameJavaKeywords(&local_40,&local_60);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"name",&local_91);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_90);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_d8,(javanano *)variables_local,field);
  RenameJavaKeywords(&local_b8,&local_d8);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"capitalized_name",&local_f9);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_f8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar3 = FieldDescriptor::number((FieldDescriptor *)variables_local);
  SimpleItoa_abi_cxx11_(&local_120,(protobuf *)(ulong)uVar3,i);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"number",&local_141);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_140);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string((string *)&local_120);
  bVar2 = Params::use_reference_types_for_primitives((Params *)descriptor_local);
  if (((!bVar2) || (bVar2 = Params::reftypes_primitive_enums((Params *)descriptor_local), bVar2)) ||
     (bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)variables_local), pmVar1 = local_20,
     bVar2)) {
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"type",&local_1b9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_1b8);
    std::__cxx11::string::operator=((string *)pmVar7,"int");
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    DefaultValue_abi_cxx11_
              (&local_1e0,(javanano *)descriptor_local,(Params *)variables_local,in_RCX);
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"default",&local_201);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_200);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"type",&local_169);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_168);
    std::__cxx11::string::operator=((string *)pmVar7,"java.lang.Integer");
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"default",&local_191);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_190);
    std::__cxx11::string::operator=((string *)pmVar7,"null");
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"repeated_default",&local_229);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_228);
  std::__cxx11::string::operator=
            ((string *)pmVar7,"com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY");
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  uVar4 = internal::WireFormat::MakeTag((FieldDescriptor *)variables_local);
  SimpleItoa_abi_cxx11_(&local_250,(protobuf *)(ulong)uVar4,i_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"tag",&local_271);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_270);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string((string *)&local_250);
  iVar5 = FieldDescriptor::number((FieldDescriptor *)variables_local);
  TVar6 = FieldDescriptor::type((FieldDescriptor *)variables_local);
  this = (protobuf *)internal::WireFormat::TagSize(iVar5,TVar6);
  SimpleItoa_abi_cxx11_(&local_298,this,i_02);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"tag_size",&local_2b9);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_2b8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string((string *)&local_298);
  iVar5 = FieldDescriptor::number((FieldDescriptor *)variables_local);
  TVar6 = FieldDescriptor::type((FieldDescriptor *)variables_local);
  type = internal::WireFormat::WireTypeForFieldType(TVar6);
  uVar4 = internal::WireFormatLite::MakeTag(iVar5,type);
  SimpleItoa_abi_cxx11_(&local_2e0,(protobuf *)(ulong)uVar4,i_01);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"non_packed_tag",&local_301);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_300);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string((string *)&local_2e0);
  pDVar8 = FieldDescriptor::containing_type((FieldDescriptor *)variables_local);
  psVar9 = Descriptor::name_abi_cxx11_(pDVar8);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_328,"message_name",(allocator *)((long)&enum_type + 7));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_328);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)psVar9);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)((long)&enum_type + 7));
  local_338 = FieldDescriptor::enum_type((FieldDescriptor *)variables_local);
  params_00 = descriptor_local;
  psVar9 = EnumDescriptor::name_abi_cxx11_(local_338);
  pDVar8 = EnumDescriptor::containing_type(local_338);
  file = EnumDescriptor::file(local_338);
  ToJavaName(&local_378,(Params *)params_00,psVar9,true,pDVar8,file);
  std::operator+(&local_358,"@",&local_378);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"message_type_intdef",&local_399);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_398);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_358);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  return;
}

Assistant:

void SetEnumVariables(const Params& params,
    const FieldDescriptor* descriptor, map<string, string>* variables) {
  (*variables)["name"] =
    RenameJavaKeywords(UnderscoresToCamelCase(descriptor));
  (*variables)["capitalized_name"] =
    RenameJavaKeywords(UnderscoresToCapitalizedCamelCase(descriptor));
  (*variables)["number"] = SimpleItoa(descriptor->number());
  if (params.use_reference_types_for_primitives()
      && !params.reftypes_primitive_enums()
      && !descriptor->is_repeated()) {
    (*variables)["type"] = "java.lang.Integer";
    (*variables)["default"] = "null";
  } else {
    (*variables)["type"] = "int";
    (*variables)["default"] = DefaultValue(params, descriptor);
  }
  (*variables)["repeated_default"] =
      "com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY";
  (*variables)["tag"] = SimpleItoa(internal::WireFormat::MakeTag(descriptor));
  (*variables)["tag_size"] = SimpleItoa(
      internal::WireFormat::TagSize(descriptor->number(), descriptor->type()));
  (*variables)["non_packed_tag"] = SimpleItoa(
      internal::WireFormatLite::MakeTag(descriptor->number(),
          internal::WireFormat::WireTypeForFieldType(descriptor->type())));
  (*variables)["message_name"] = descriptor->containing_type()->name();
  const EnumDescriptor* enum_type = descriptor->enum_type();
  (*variables)["message_type_intdef"] = "@"
      + ToJavaName(params, enum_type->name(), true,
          enum_type->containing_type(), enum_type->file());
}